

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O0

void worker(void *arg)

{
  int iVar1;
  bool bVar2;
  undefined1 local_1b [3];
  int local_18;
  int iStack_14;
  char buf [3];
  int s;
  int rc;
  void *arg_local;
  
  local_18 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c"
                              ,0x24,1,0x10);
  iStack_14 = nn_recv(local_18,local_1b,3,0);
  bVar2 = false;
  if (iStack_14 == -1) {
    iVar1 = nn_errno();
    bVar2 = iVar1 == 0x9523dfd;
  }
  if (!bVar2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == ETERM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x29);
    fflush(_stderr);
    nn_err_abort();
  }
  iStack_14 = nn_recv(local_18,local_1b,3,0);
  bVar2 = false;
  if (iStack_14 == -1) {
    iVar1 = nn_errno();
    bVar2 = iVar1 == 0x9523dfd;
  }
  if (!bVar2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == ETERM",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x2d);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c"
                  ,0x2e,local_18);
  return;
}

Assistant:

static void worker (NN_UNUSED void *arg)
{
    int rc;
    int s;
    char buf [3];

    /*  Test socket. */
    s = test_socket (AF_SP, NN_PAIR);

    /*  Launch blocking function to check that it will be unblocked once
        nn_term() is called from the main thread. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);

    /*  Check that all subsequent operations fail in synchronous manner. */
    rc = nn_recv (s, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == ETERM);
    test_close (s);
}